

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

array<float,_4> __thiscall pbrt::HairBxDF::ComputeApPDF(HairBxDF *this,Float cosTheta_o)

{
  float fVar1;
  iterator pvVar2;
  float *pfVar3;
  SampledSpectrum *in_RDI;
  float in_XMM0_Da;
  float v;
  Float FVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  ulong extraout_XMM0_Qb;
  undefined1 extraout_var_00 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  SampledSpectrum SVar15;
  array<float,_4> aVar16;
  int i;
  SampledSpectrum *as;
  iterator __end1;
  iterator __begin1;
  array<pbrt::SampledSpectrum,_4> *__range1;
  Float sumY;
  array<pbrt::SampledSpectrum,_4> ap;
  SampledSpectrum T;
  Float gamma_t;
  Float cosGamma_t;
  Float sinGamma_t;
  Float etap;
  Float cosTheta_t;
  Float sinTheta_t;
  Float sinTheta_o;
  array<float,_4> apPDF;
  Float in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  int local_d4;
  iterator local_c0;
  float local_ac;
  array<pbrt::SampledSpectrum,_4> local_a8;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  SampledSpectrum *pSVar17;
  Float in_stack_fffffffffffffff0;
  Float in_stack_fffffffffffffff4;
  float local_8 [2];
  undefined1 auVar18 [12];
  undefined1 extraout_var [60];
  undefined1 auVar10 [56];
  undefined8 uVar19;
  undefined1 auVar14 [56];
  
  vfnmadd213ss_fma(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),
                   SUB6416(ZEXT464(0x3f800000),0));
  pSVar17 = in_RDI;
  v = SafeSqrt(0.0);
  FVar4 = (Float)((ulong)pSVar17 >> 0x20);
  local_24 = v / (in_RDI->values).values[2];
  Sqr<float>(local_24);
  local_28 = SafeSqrt(0.0);
  fVar1 = (in_RDI->values).values[2];
  auVar6._0_4_ = Sqr<float>(v);
  auVar6._4_60_ = extraout_var;
  auVar5 = ZEXT416((uint)fVar1);
  vfmsub213ss_fma(auVar5,auVar5,auVar6._0_16_);
  local_2c = SafeSqrt(0.0);
  local_2c = local_2c / in_XMM0_Da;
  local_30 = (in_RDI->values).values[0] / local_2c;
  Sqr<float>(local_30);
  auVar14 = ZEXT856(extraout_XMM0_Qb);
  local_34 = SafeSqrt(0.0);
  local_38 = SafeASin(0.0);
  auVar10 = extraout_var_00;
  SVar15 = SampledSpectrum::operator-(in_RDI);
  auVar11._0_8_ = SVar15.values.values._8_8_;
  auVar11._8_56_ = auVar14;
  auVar7._0_8_ = SVar15.values.values._0_8_;
  auVar7._8_56_ = auVar10;
  local_68 = vmovlpd_avx(auVar7._0_16_);
  local_60 = vmovlpd_avx(auVar11._0_16_);
  auVar14 = (undefined1  [56])0x0;
  auVar10 = ZEXT856(0);
  SVar15 = SampledSpectrum::operator*
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      in_stack_ffffffffffffff0c);
  auVar12._0_8_ = SVar15.values.values._8_8_;
  auVar12._8_56_ = auVar14;
  auVar8._0_8_ = SVar15.values.values._0_8_;
  auVar8._8_56_ = auVar10;
  local_58 = vmovlpd_avx(auVar8._0_16_);
  local_50 = vmovlpd_avx(auVar12._0_16_);
  SVar15 = Exp((SampledSpectrum *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  auVar13._0_8_ = SVar15.values.values._8_8_;
  auVar13._8_56_ = auVar14;
  auVar9._0_8_ = SVar15.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  local_48 = vmovlpd_avx(auVar9._0_16_);
  local_40 = vmovlpd_avx(auVar13._0_16_);
  Ap(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,FVar4,
     (SampledSpectrum *)CONCAT44(in_XMM0_Da,v));
  pstd::array<float,_4>::array((array<float,_4> *)&stack0xfffffffffffffff0);
  local_ac = 0.0;
  local_c0 = pstd::array<pbrt::SampledSpectrum,_4>::begin(&local_a8);
  pvVar2 = pstd::array<pbrt::SampledSpectrum,_4>::end(&local_a8);
  for (; local_c0 != pvVar2; local_c0 = local_c0 + 1) {
    FVar4 = SampledSpectrum::Average
                      ((SampledSpectrum *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_ac = FVar4 + local_ac;
  }
  for (local_d4 = 0; local_d4 < 4; local_d4 = local_d4 + 1) {
    pstd::array<pbrt::SampledSpectrum,_4>::operator[](&local_a8,(long)local_d4);
    FVar4 = SampledSpectrum::Average
                      ((SampledSpectrum *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff14 = FVar4 / local_ac;
    pfVar3 = pstd::array<float,_4>::operator[]
                       ((array<float,_4> *)&stack0xfffffffffffffff0,(long)local_d4);
    *pfVar3 = in_stack_ffffffffffffff14;
  }
  aVar16.values[0] = in_stack_fffffffffffffff0;
  auVar18._4_4_ = in_stack_fffffffffffffff4;
  register0x00001240 = local_8[0];
  register0x00001244 = local_8[1];
  return (array<float,_4>)aVar16.values;
}

Assistant:

pstd::array<Float, HairBxDF::pMax + 1> HairBxDF::ComputeApPDF(Float cosTheta_o) const {
    // Compute array of $A_p$ values for _cosThetaO_
    Float sinTheta_o = SafeSqrt(1 - cosTheta_o * cosTheta_o);
    // Compute $\cos \thetat$ for refracted ray
    Float sinTheta_t = sinTheta_o / eta;
    Float cosTheta_t = SafeSqrt(1 - Sqr(sinTheta_t));

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute the transmittance _T_ of a single path through the cylinder
    SampledSpectrum T = Exp(-sigma_a * (2 * cosGamma_t / cosTheta_t));

    pstd::array<SampledSpectrum, pMax + 1> ap = Ap(cosTheta_o, eta, h, T);

    // Compute $A_p$ PDF from individual $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF;
    Float sumY = 0;
    for (const SampledSpectrum &as : ap)
        sumY += as.Average();
    for (int i = 0; i <= pMax; ++i)
        apPDF[i] = ap[i].Average() / sumY;

    return apPDF;
}